

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

void __thiscall CVmObjIterIdx::set_cur_index(CVmObjIterIdx *this,vm_obj_id_t self,long idx)

{
  unsigned_long uVar1;
  vm_obj_id_t in_ESI;
  CVmUndo *in_RDI;
  vm_val_t dummy;
  unsigned_long in_stack_ffffffffffffffb8;
  CVmUndo *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8;
  vm_val_t local_28;
  vm_obj_id_t local_c;
  
  if (G_undo_X != (CVmUndo *)0x0) {
    local_c = in_ESI;
    uVar1 = get_flags((CVmObjIterIdx *)0x366f13);
    if ((uVar1 & 1) == 0) {
      vm_val_t::set_nil(&local_28);
      in_stack_ffffffffffffffc0 = G_undo_X;
      get_cur_index((CVmObjIterIdx *)0x366f48);
      CVmUndo::add_new_record_int_key
                (in_RDI,local_c,in_stack_ffffffffffffffc8,(vm_val_t *)in_stack_ffffffffffffffc0);
      get_flags((CVmObjIterIdx *)0x366f67);
      set_flags((CVmObjIterIdx *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  set_cur_index_no_undo((CVmObjIterIdx *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void CVmObjIterIdx::set_cur_index(VMG_ vm_obj_id_t self, long idx)
{
    /* save undo if necessary */
    if (G_undo != 0 && !(get_flags() & VMOBJITERIDX_UNDO))
    {
        vm_val_t dummy;
        
        /* 
         *   Add the undo record.  Note that the only information we need
         *   to store is the index value, so we can store this as the key
         *   value - supply a dummy payload, since we have no use for it. 
         */
        dummy.set_nil();
        G_undo->add_new_record_int_key(vmg_ self, get_cur_index(), &dummy);

        /* 
         *   set the undo bit so we don't save redundant undo for this
         *   savepoint 
         */
        set_flags(get_flags() | VMOBJITERIDX_UNDO);
    }

    /* set the index */
    set_cur_index_no_undo(idx);
}